

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
 __thiscall spvtools::opt::analysis::BoolConstant::Copy(BoolConstant *this)

{
  pointer __p;
  BoolConstant *this_local;
  
  this_local = this;
  CopyBoolConstant((BoolConstant *)&stack0xffffffffffffffe0);
  __p = std::
        unique_ptr<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>_>
        ::release((unique_ptr<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>_>
                   *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
  ::unique_ptr<std::default_delete<spvtools::opt::analysis::Constant>,void>
            ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
              *)this,(pointer)__p);
  std::
  unique_ptr<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>_>
  ::~unique_ptr((unique_ptr<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>_>
                 *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Constant> Copy() const override {
    return std::unique_ptr<Constant>(CopyBoolConstant().release());
  }